

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

char * iraf2str(char *irafstring,int nchar)

{
  uint local_30;
  int local_2c;
  int j;
  int i;
  char *string;
  int nchar_local;
  char *irafstring_local;
  
  irafstring_local = (char *)calloc((long)(nchar + 1),1);
  if (irafstring_local == (char *)0x0) {
    ffpmsg("IRAF2STR Cannot allocate memory for string variable");
    irafstring_local = (char *)0x0;
  }
  else {
    local_30 = (uint)(*irafstring == '\0');
    for (local_2c = 0; local_2c < nchar; local_2c = local_2c + 1) {
      irafstring_local[local_2c] = irafstring[(int)local_30];
      local_30 = local_30 + 2;
    }
  }
  return irafstring_local;
}

Assistant:

static char *iraf2str (

char	*irafstring,	/* IRAF 2-byte/character string */
int	nchar)		/* Number of characters in string */
{
    char *string;
    int i, j;

    string = (char *) calloc (nchar+1, 1);
    if (string == NULL) {
	ffpmsg("IRAF2STR Cannot allocate memory for string variable");
	return (NULL);
	}

    /* the chars are in bytes 1, 3, 5, ... if bigendian format (SUN) */
    /* else in bytes 0, 2, 4, ... if little endian format (Alpha)    */

    if (irafstring[0] != 0)
	j = 0;
    else
	j = 1;

    /* Convert appropriate byte of input to output character */
    for (i = 0; i < nchar; i++) {
	string[i] = irafstring[j];
	j = j + 2;
	}

    return (string);
}